

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

bool __thiscall
google::
dense_hashtable<std::pair<int_const,int>,int,TransparentHasher,google::dense_hash_map<int,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::
unserialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,std::__cxx11::stringstream>
          (dense_hashtable<std::pair<int_const,int>,int,TransparentHasher,google::dense_hash_map<int,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           *this,basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *param_2)

{
  bool bVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  int bit;
  long lVar5;
  uchar bits;
  size_type new_num_buckets;
  MagicNumberType magic_read;
  byte local_49;
  long local_48;
  size_type local_40;
  unsigned_long local_38;
  
  dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::clear((dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)this);
  bVar1 = sparsehash_internal::read_bigendian_number<std::__cxx11::stringstream,unsigned_long>
                    (param_2,&local_38,4);
  if (((bVar1) && (local_38 == 0x13578642)) &&
     (bVar1 = sparsehash_internal::read_bigendian_number<std::__cxx11::stringstream,unsigned_long>
                        (param_2,&local_40,8), bVar1)) {
    dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::clear_to_size((dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                     *)this,local_40);
    bVar1 = sparsehash_internal::read_bigendian_number<std::__cxx11::stringstream,unsigned_long>
                      (param_2,(unsigned_long *)(this + 0x50),8);
    if (bVar1) {
      if (*(long *)(this + 0x58) == 0) {
        return true;
      }
      lVar3 = 0;
      uVar4 = 0;
      while (plVar2 = (long *)std::istream::read((char *)param_2,(long)&local_49),
            *(int *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) == 0) {
        lVar5 = 0;
        local_48 = lVar3;
        do {
          if (((lVar5 + uVar4 < *(ulong *)(this + 0x58)) &&
              ((local_49 >> ((uint)lVar5 & 0x1f) & 1) != 0)) &&
             (plVar2 = (long *)std::istream::read((char *)param_2,*(long *)(this + 0x70) + lVar3),
             *(int *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) != 0)) {
            return false;
          }
          lVar5 = lVar5 + 1;
          lVar3 = lVar3 + 8;
        } while (lVar5 != 8);
        uVar4 = uVar4 + 8;
        lVar3 = local_48 + 0x40;
        if (*(ulong *)(this + 0x58) <= uVar4) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool unserialize(ValueSerializer serializer, INPUT* fp) {
    assert(settings.use_empty() && "empty_key not set for read");

    clear();  // just to be consistent
    MagicNumberType magic_read;
    if (!sparsehash_internal::read_bigendian_number(fp, &magic_read, 4))
      return false;
    if (magic_read != MAGIC_NUMBER) {
      return false;
    }
    size_type new_num_buckets;
    if (!sparsehash_internal::read_bigendian_number(fp, &new_num_buckets, 8))
      return false;
    clear_to_size(new_num_buckets);
    if (!sparsehash_internal::read_bigendian_number(fp, &num_elements, 8))
      return false;

    // Read the bitmap of non-empty buckets.
    for (size_type i = 0; i < num_buckets; i += 8) {
      unsigned char bits;
      if (!sparsehash_internal::read_data(fp, &bits, sizeof(bits)))
        return false;
      for (int bit = 0; bit < 8; ++bit) {
        if (i + bit < num_buckets && (bits & (1 << bit))) {  // not empty
          if (!serializer(fp, &table[i + bit])) return false;
        }
      }
    }
    return true;
  }